

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_sight.cpp
# Opt level: O3

bool __thiscall SightCheck::PTR_SightTraverse(SightCheck *this,intercept_t *in)

{
  F3DFloor **ppFVar1;
  double dVar2;
  int iVar3;
  line_t_conflict *linedef;
  extsector_t *peVar4;
  F3DFloor *pFVar5;
  secplane_t *psVar6;
  secplane_t *psVar7;
  long *plVar8;
  double *pdVar9;
  double *pdVar10;
  undefined1 auVar11 [16];
  double dVar12;
  double dVar13;
  SightTask *pSVar14;
  bool bVar15;
  sector_t_conflict **ppsVar16;
  uint uVar17;
  ulong uVar18;
  long lVar19;
  sector_t_conflict *psVar20;
  sector_t_conflict **ppsVar21;
  int i;
  int iVar22;
  F3DFloor **ppFVar23;
  uint uVar24;
  FLinePortal *pFVar25;
  sector_t_conflict **ppsVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dStack_70;
  SightOpening local_48;
  
  linedef = (in->d).line;
  if (((i_compatflags._1_1_ & 0x20) == 0) || (linedef->frontsector != linedef->backsector)) {
    dVar2 = in->frac;
    dVar12 = dVar2 * (this->Trace).dx + (this->Trace).x;
    dVar13 = dVar2 * (this->Trace).dy + (this->Trace).y;
    auVar11._8_4_ = SUB84(dVar13,0);
    auVar11._0_8_ = dVar12;
    auVar11._12_4_ = (int)((ulong)dVar13 >> 0x20);
    P_SightOpening(this,&local_48,linedef,dVar12,dVar13);
    pFVar25 = (FLinePortal *)0x0;
    if (linedef->portalindex < linePortals.Count) {
      pFVar25 = linePortals.Array + linedef->portalindex;
    }
    if ((local_48.range != 0 || local_48.portalflags != 0) ||
       ((pFVar25 != (FLinePortal *)0x0 && (pFVar25->mType == '\x03')))) {
      if ((dVar2 == 0.0) && (!NAN(dVar2))) {
        return true;
      }
      if ((-3.4028234663852886e+38 < local_48.bottom) &&
         (dVar27 = (local_48.bottom - (this->sightstart).Z) / dVar2,
         this->bottomslope <= dVar27 && dVar27 != this->bottomslope)) {
        this->bottomslope = dVar27;
      }
      if ((local_48.top < 3.4028234663852886e+38) &&
         (dVar27 = (local_48.top - (this->sightstart).Z) / dVar2, dVar27 < this->topslope)) {
        this->topslope = dVar27;
      }
      if (local_48.portalflags == 0) {
        uVar17 = 0xffffffff;
      }
      else {
        dVar27 = (linedef->delta).Y * ((linedef->v1->p).X - (this->sightstart).X) +
                 (linedef->delta).X * ((this->sightstart).Y - (linedef->v1->p).Y);
        psVar20 = linedef->backsector;
        uVar24 = local_48.portalflags;
        if (1.52587890625e-05 < dVar27) {
          if (psVar20 == (sector_t_conflict *)0x0) goto LAB_0044f46f;
          psVar20 = linedef->frontsector;
          uVar24 = ((uint)local_48.portalflags >> 1 & 5) + (local_48.portalflags & 5U) * 2;
        }
        iVar22 = this->portaldir;
        if (iVar22 != 0) {
          if ((uVar24 & 3) == 2) {
            iVar22 = (sectorPortals.Array[psVar20->Portals[1]].mDestination)->PortalGroup;
            dVar28 = this->topslope;
            dVar29 = this->bottomslope;
            TArray<SightTask,_SightTask>::Grow(&portals,1);
            pSVar14 = portals.Array;
            uVar18 = (ulong)portals.Count;
            portals.Array[uVar18].Frac = dVar2;
            pSVar14[uVar18].topslope = dVar28;
            (&pSVar14[uVar18].topslope)[1] = dVar29;
            pSVar14[uVar18].direction = 1;
            pSVar14[uVar18].portalgroup = iVar22;
            portals.Count = portals.Count + 1;
            iVar22 = this->portaldir;
          }
          uVar17 = (uint)(1.52587890625e-05 < dVar27);
          if (iVar22 == 1) goto LAB_0044f3f9;
        }
        uVar17 = (uint)(1.52587890625e-05 < dVar27);
        if ((uVar24 & 0xc) == 8) {
          dVar2 = in->frac;
          iVar22 = (sectorPortals.Array[psVar20->Portals[0]].mDestination)->PortalGroup;
          dVar27 = this->topslope;
          dVar28 = this->bottomslope;
          TArray<SightTask,_SightTask>::Grow(&portals,1);
          pSVar14 = portals.Array;
          uVar18 = (ulong)portals.Count;
          portals.Array[uVar18].Frac = dVar2;
          pSVar14[uVar18].topslope = dVar27;
          (&pSVar14[uVar18].topslope)[1] = dVar28;
          pSVar14[uVar18].direction = 0;
          pSVar14[uVar18].portalgroup = iVar22;
          portals.Count = portals.Count + 1;
        }
      }
LAB_0044f3f9:
      dStack_70 = auVar11._8_8_;
      if (pFVar25 == (FLinePortal *)0x0) {
        if (local_48.range == 0) {
          return false;
        }
        dVar2 = this->topslope;
        dVar27 = this->bottomslope;
        if (dVar2 <= dVar27) {
          return false;
        }
        if (((linedef->frontsector->e->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count ==
             0) && ((linedef->backsector->e->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.
                    Count == 0)) {
          this->lastsector = (sector_t_conflict *)0x0;
          dVar28 = in->frac;
          dVar29 = (this->sightstart).Z;
        }
        else {
          if (uVar17 == 0xffffffff) {
            uVar17 = (uint)(1.52587890625e-05 <
                           (linedef->delta).Y * ((linedef->v1->p).X - (this->sightstart).X) +
                           (linedef->delta).X * ((this->sightstart).Y - (linedef->v1->p).Y));
          }
          ppsVar21 = &linedef->frontsector;
          ppsVar26 = &linedef->backsector;
          dVar28 = in->frac;
          dVar29 = (this->sightstart).Z;
          iVar22 = 1;
          do {
            ppsVar16 = ppsVar26;
            if (iVar22 == 1) {
              ppsVar16 = ppsVar21;
            }
            psVar20 = *ppsVar16;
            peVar4 = psVar20->e;
            uVar18 = (ulong)(peVar4->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
            if (uVar18 != 0) {
              dVar31 = dVar2 * dVar28;
              dVar32 = dVar28 * dVar27;
              ppFVar23 = (peVar4->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array;
              ppsVar16 = ppsVar26;
              if (iVar22 == 2) {
                ppsVar16 = ppsVar21;
              }
              ppFVar1 = ppFVar23 + uVar18;
              dVar33 = dVar27;
              do {
                pFVar5 = *ppFVar23;
                uVar24 = pFVar5->flags;
                if (((uVar24 & 1) != 0 && (uVar24 & 0x2000000) != this->myseethrough) &&
                   (((uVar24 & 2) != 0 || ((this->Flags & 8U) == 0)))) {
                  psVar6 = (pFVar5->bottom).plane;
                  psVar7 = (pFVar5->top).plane;
                  dVar36 = ((psVar6->normal).Y * dStack_70 + psVar6->D + (psVar6->normal).X * dVar12
                           ) * psVar6->negiC;
                  dVar35 = ((psVar7->normal).Y * dStack_70 + psVar7->D + (psVar7->normal).X * dVar12
                           ) * psVar7->negiC;
                  dVar34 = (dVar35 - dVar29) / dVar28;
                  dVar37 = (dVar36 - dVar29) / dVar28;
                  if (dVar2 <= dVar34) {
                    if (dVar37 <= dVar33) goto LAB_0044f46f;
                    if (dVar37 < dVar2) {
                      this->topslope = dVar37;
                      dVar2 = dVar37;
                    }
                  }
                  else if (dVar37 <= dVar33) {
                    if (dVar33 < dVar34) {
                      this->bottomslope = dVar34;
                      dVar27 = dVar34;
                      dVar33 = dVar34;
                    }
                  }
                  else {
                    uVar18 = (ulong)((*ppsVar16)->e->XFloor).ffloors.
                                    super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
                    if (uVar18 != 0) {
                      lVar19 = 0;
                      do {
                        plVar8 = *(long **)((long)((*ppsVar16)->e->XFloor).ffloors.
                                                  super_TArray<F3DFloor_*,_F3DFloor_*>.Array +
                                           lVar19);
                        if ((*(uint *)(plVar8 + 0xb) & 1) != 0 &&
                            (*(uint *)(plVar8 + 0xb) & 0x2000000) != this->myseethrough) {
                          pdVar9 = (double *)*plVar8;
                          pdVar10 = (double *)plVar8[5];
                          dVar30 = (pdVar9[1] * dStack_70 + pdVar9[3] + *pdVar9 * dVar12) *
                                   pdVar9[4];
                          dVar38 = (pdVar10[1] * dVar13 + *pdVar10 * dVar12 + pdVar10[3]) *
                                   pdVar10[4];
                          if (((dVar36 <= dVar30) && (dVar30 <= dVar35)) ||
                             ((dVar38 <= dVar35 && (dVar36 <= dVar38)))) goto LAB_0044f46f;
                          if (dVar35 <= dVar38 && dVar30 <= dVar36) {
                            return false;
                          }
                          if (dVar36 <= dVar30 && dVar38 <= dVar35) {
                            return false;
                          }
                        }
                        lVar19 = lVar19 + 8;
                      } while (uVar18 << 3 != lVar19);
                    }
                  }
                  if (uVar17 == iVar22 - 1U && psVar20 == this->lastsector) {
                    if ((this->Lastztop <= dVar36) && (dVar35 < dVar31 + dVar29)) {
                      this->topslope = dVar37;
                      dVar2 = dVar37;
                    }
                    if ((dVar35 <= this->Lastzbottom) && (dVar32 + dVar29 < dVar35)) {
                      this->bottomslope = dVar34;
                      dVar33 = dVar34;
                      dVar27 = dVar34;
                    }
                  }
                  if (dVar2 <= dVar33) goto LAB_0044f46f;
                }
                ppFVar23 = ppFVar23 + 1;
              } while (ppFVar23 != ppFVar1);
            }
            iVar22 = iVar22 + 1;
          } while (iVar22 != 3);
          if (uVar17 == 0) {
            ppsVar21 = ppsVar26;
          }
          this->lastsector = *ppsVar21;
        }
        this->Lastztop = dVar2 * dVar28 + dVar29;
        this->Lastzbottom = dVar27 * dVar28 + dVar29;
        goto LAB_0044f875;
      }
      dVar2 = in->frac;
      iVar22 = this->portaldir;
      iVar3 = pFVar25->mDestination->frontsector->PortalGroup;
      dVar12 = this->topslope;
      dVar13 = this->bottomslope;
      TArray<SightTask,_SightTask>::Grow(&portals,1);
      pSVar14 = portals.Array;
      uVar18 = (ulong)portals.Count;
      portals.Array[uVar18].Frac = dVar2;
      pSVar14[uVar18].topslope = dVar12;
      (&pSVar14[uVar18].topslope)[1] = dVar13;
      pSVar14[uVar18].direction = iVar22;
      pSVar14[uVar18].portalgroup = iVar3;
      portals.Count = portals.Count + 1;
    }
LAB_0044f46f:
    bVar15 = false;
  }
  else {
LAB_0044f875:
    bVar15 = true;
  }
  return bVar15;
}

Assistant:

bool SightCheck::PTR_SightTraverse (intercept_t *in)
{
	line_t  *li;
	double slope;
	SightOpening open;
	int  frontflag = -1;

	li = in->d.line;

//
// crosses a two sided line
//

	// ignore self referencing sectors if COMPAT_TRACE is on
	if ((i_compatflags & COMPATF_TRACE) && li->frontsector == li->backsector) 
		return true;

	double trX = Trace.x + Trace.dx * in->frac;
	double trY = Trace.y + Trace.dy * in->frac;
	P_SightOpening (open, li, trX, trY);

	FLinePortal *lport = li->getPortal();

	if (open.range == 0 && open.portalflags == 0 && (lport == NULL || lport->mType != PORTT_LINKED))		// quick test for totally closed doors (must be delayed if portal checks are needed, though)
		return false;		// stop

	if (in->frac == 0)
		return true;

	// check bottom
	if (open.bottom > LINEOPEN_MIN)
	{
		slope = (open.bottom - sightstart.Z) / in->frac;
		if (slope > bottomslope)
			bottomslope = slope;
	}

	// check top
	if (open.top < LINEOPEN_MAX)
	{
		slope = (open.top - sightstart.Z) / in->frac;
		if (slope < topslope)
			topslope = slope;
	}

	if (open.portalflags)
	{
		sector_t *frontsec, *backsec;
		frontflag = P_PointOnLineSidePrecise(sightstart, li);
		if (!frontflag)
		{
			frontsec = li->frontsector;
			backsec = li->backsector;
		}
		else
		{
			frontsec = li->backsector;
			if (!frontsec) return false;	// We are looking through the backside of a one-sided line. Just abort if that happens.
			backsec = li->frontsector;
			open.SwapSides();				// swap flags to make the next checks simpler.
		}

		if (portaldir != sector_t::floor && (open.portalflags & SO_TOPBACK) && !(open.portalflags & SO_TOPFRONT))
		{
			portals.Push({ in->frac, topslope, bottomslope, sector_t::ceiling, backsec->GetOppositePortalGroup(sector_t::ceiling) });
		}
		if (portaldir != sector_t::ceiling && (open.portalflags & SO_BOTTOMBACK) && !(open.portalflags & SO_BOTTOMFRONT))
		{
			portals.Push({ in->frac, topslope, bottomslope, sector_t::floor, backsec->GetOppositePortalGroup(sector_t::floor) });
		}
	}
	if (lport)
	{
		portals.Push({ in->frac, topslope, bottomslope, portaldir, lport->mDestination->frontsector->PortalGroup });
		return false;
	}

	if (topslope <= bottomslope || open.range == 0)
		return false;		// stop

	// now handle 3D-floors
	if(li->frontsector->e->XFloor.ffloors.Size() || li->backsector->e->XFloor.ffloors.Size())
	{
		if (frontflag == -1) frontflag = P_PointOnLineSidePrecise(sightstart, li);
		
		//Check 3D FLOORS!
		for(int i=1;i<=2;i++)
		{
			sector_t * s=i==1? li->frontsector:li->backsector;
			double    highslope, lowslope;

			double topz= topslope * in->frac + sightstart.Z;
			double bottomz= bottomslope * in->frac + sightstart.Z;

			for (auto rover : s->e->XFloor.ffloors)
			{
				if ((rover->flags & FF_SEETHROUGH) == myseethrough || !(rover->flags & FF_EXISTS)) continue;
				if ((Flags & SF_IGNOREWATERBOUNDARY) && (rover->flags & FF_SOLID) == 0) continue;

				double ff_bottom = rover->bottom.plane->ZatPoint(trX, trY);
				double ff_top = rover->top.plane->ZatPoint(trX, trY);

				highslope = (ff_top - sightstart.Z) / in->frac;
				lowslope = (ff_bottom - sightstart.Z) / in->frac;

				if (highslope >= topslope)
				{
					// blocks completely
					if (lowslope <= bottomslope) return false;
					// blocks upper edge of view
					if (lowslope < topslope) topslope = lowslope;
				}
				else if (lowslope <= bottomslope)
				{
					// blocks lower edge of view
					if (highslope > bottomslope)  bottomslope = highslope;
				}
				else
				{
					// the 3D-floor is inside the viewing cone but neither clips the top nor the bottom so by 
					// itself it can't be view blocking.
					// However, if there's a 3D-floor on the other side that obstructs the same vertical range
					// the 2 together will block sight.
					sector_t * sb = i == 2 ? li->frontsector : li->backsector;

					for (auto rover2 : sb->e->XFloor.ffloors)
					{
						if ((rover2->flags & FF_SEETHROUGH) == myseethrough || !(rover2->flags & FF_EXISTS)) continue;
						if ((Flags & SF_IGNOREWATERBOUNDARY) && (rover->flags & FF_SOLID) == 0) continue;

						double ffb_bottom = rover2->bottom.plane->ZatPoint(trX, trY);
						double ffb_top = rover2->top.plane->ZatPoint(trX, trY);

						if ((ffb_bottom >= ff_bottom && ffb_bottom <= ff_top) ||
							(ffb_top <= ff_top && ffb_top >= ff_bottom) ||
							(ffb_top >= ff_top && ffb_bottom <= ff_bottom) ||
							(ffb_top <= ff_top && ffb_bottom >= ff_bottom))
						{
							return false;
						}
					}
				}
				// trace is leaving a sector with a 3d-floor
				if (s == lastsector && frontflag == i - 1)
				{
					// upper slope intersects with this 3d-floor
					if (Lastztop <= ff_bottom && topz > ff_top)
					{
						topslope = lowslope;
					}
					// lower slope intersects with this 3d-floor
					if (Lastzbottom >= ff_top && bottomz < ff_top)
					{
						bottomslope = highslope;
					}
				}
				if (topslope <= bottomslope) return false;		// stop
			}
		}
		lastsector = frontflag==0 ? li->backsector : li->frontsector;
	}
	else lastsector=NULL;	// don't need it if there are no 3D-floors

	Lastztop = (topslope * in->frac) + sightstart.Z;
	Lastzbottom = (bottomslope * in->frac) + sightstart.Z;

	return true;			// keep going
}